

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

void mbedtls_ssl_session_free(mbedtls_ssl_session *session)

{
  long lVar1;
  
  if (session != (mbedtls_ssl_session *)0x0) {
    if (session->peer_cert != (mbedtls_x509_crt *)0x0) {
      mbedtls_x509_crt_free(session->peer_cert);
      free(session->peer_cert);
    }
    free(session->ticket);
    lVar1 = 0;
    do {
      session->id[lVar1 + -0x18] = '\0';
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x98);
  }
  return;
}

Assistant:

void mbedtls_ssl_session_free( mbedtls_ssl_session *session )
{
    if( session == NULL )
        return;

#if defined(MBEDTLS_X509_CRT_PARSE_C)
    if( session->peer_cert != NULL )
    {
        mbedtls_x509_crt_free( session->peer_cert );
        mbedtls_free( session->peer_cert );
    }
#endif

#if defined(MBEDTLS_SSL_SESSION_TICKETS) && defined(MBEDTLS_SSL_CLI_C)
    mbedtls_free( session->ticket );
#endif

    mbedtls_zeroize( session, sizeof( mbedtls_ssl_session ) );
}